

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall duckdb_re2::RE2::CheckRewriteString(RE2 *this,StringPiece *rewrite,string *error)

{
  size_type sVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  string local_50;
  
  sVar1 = rewrite->size_;
  bVar9 = 0 < (long)sVar1;
  if ((long)sVar1 < 1) {
    uVar6 = 0xffffffff;
  }
  else {
    pcVar8 = rewrite->data_;
    pcVar7 = pcVar8 + sVar1;
    uVar6 = 0xffffffff;
    do {
      bVar2 = false;
      if (*pcVar8 == '\\') {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 == pcVar7) {
          pcVar5 = (char *)error->_M_string_length;
          pcVar4 = "Rewrite schema error: \'\\\' not allowed at end.";
LAB_011e0715:
          std::__cxx11::string::_M_replace((ulong)error,0,pcVar5,(ulong)pcVar4);
          bVar2 = true;
        }
        else if (*pcVar8 != 0x5c) {
          uVar3 = (int)*pcVar8 - 0x30;
          if (9 < uVar3) {
            pcVar5 = (char *)error->_M_string_length;
            pcVar4 = "Rewrite schema error: \'\\\' must be followed by a digit or \'\\\'.";
            goto LAB_011e0715;
          }
          if ((int)uVar6 <= (int)uVar3) {
            uVar6 = uVar3;
          }
          bVar2 = false;
        }
      }
      if (bVar2) break;
      pcVar8 = pcVar8 + 1;
      bVar9 = pcVar8 < pcVar7;
    } while (bVar9);
  }
  if (!bVar9) {
    if ((int)uVar6 <= this->num_captures_) {
      return true;
    }
    StringPrintf_abi_cxx11_
              (&local_50,
               "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
               ,(ulong)uVar6);
    std::__cxx11::string::operator=((string *)error,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return false;
}

Assistant:

bool RE2::CheckRewriteString(const StringPiece& rewrite,
                             std::string* error) const {
  int max_token = -1;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c != '\\') {
      continue;
    }
    if (++s == end) {
      *error = "Rewrite schema error: '\\' not allowed at end.";
      return false;
    }
    c = *s;
    if (c == '\\') {
      continue;
    }
    if (!isdigit(c)) {
      *error = "Rewrite schema error: "
               "'\\' must be followed by a digit or '\\'.";
      return false;
    }
    int n = (c - '0');
    if (max_token < n) {
      max_token = n;
    }
  }

  if (max_token > NumberOfCapturingGroups()) {
    *error = StringPrintf(
        "Rewrite schema requests %d matches, but the regexp only has %d "
        "parenthesized subexpressions.",
        max_token, NumberOfCapturingGroups());
    return false;
  }
  return true;
}